

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O2

string * __thiscall
smf::Options::getCommand_abi_cxx11_(string *__return_storage_ptr__,Options *this)

{
  pointer pbVar1;
  allocator local_9;
  
  pbVar1 = (this->m_argument).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_argument).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish == pbVar1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_9);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pbVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Options::getCommand(void) {
	if (m_argument.size() == 0) {
		return "";
	} else {
		return m_argument[0];
	}
}